

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O2

ReadFileResult anon_unknown.dwarf_23968::ResourceIdHelper(string *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  allocator<char> local_e9;
  string local_e8;
  RegularExpressionMatch match;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::String
            ((cmJSONHelper<std::string,_cmCTestResourceSpec::ReadFileResult> *)&match,READ_OK,
             INVALID_RESOURCE,&local_e8);
  RVar2 = std::
          function<cmCTestResourceSpec::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::operator()((function<cmCTestResourceSpec::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                        *)&match,out,value);
  std::_Function_base::~_Function_base((_Function_base *)&match);
  std::__cxx11::string::~string((string *)&local_e8);
  if (RVar2 == READ_OK) {
    memset(&match,0,0xa8);
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)(anonymous_namespace)::IdRegex,(out->_M_dataplus)._M_p,
                       &match);
    RVar2 = (uint)!bVar1 + (uint)!bVar1 * 8;
  }
  return RVar2;
}

Assistant:

cmCTestResourceSpec::ReadFileResult ResourceIdHelper(std::string& out,
                                                     const Json::Value* value)
{
  auto result = JSONHelperBuilder::String(
    cmCTestResourceSpec::ReadFileResult::READ_OK,
    cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE)(out, value);
  if (result != cmCTestResourceSpec::ReadFileResult::READ_OK) {
    return result;
  }
  cmsys::RegularExpressionMatch match;
  if (!IdRegex.find(out.c_str(), match)) {
    return cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE;
  }
  return cmCTestResourceSpec::ReadFileResult::READ_OK;
}